

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

Socket * new_unix_listener(SockAddr *listenaddr,Plug *plug)

{
  int iVar1;
  NetSocket *s_00;
  int *piVar2;
  char *pcVar3;
  int retcode;
  NetSocket *ret;
  int addrlen;
  sockaddr_union *addr;
  sockaddr_union u;
  Plug *pPStack_20;
  int s;
  Plug *plug_local;
  SockAddr *listenaddr_local;
  
  pPStack_20 = plug;
  plug_local = (Plug *)listenaddr;
  s_00 = (NetSocket *)safemalloc(1,0x98,0);
  (s_00->sock).vt = &NetSocket_sockvt;
  s_00->error = (char *)0x0;
  s_00->plug = pPStack_20;
  bufchain_init(&s_00->output_data);
  s_00->writable = false;
  s_00->sending_oob = 0;
  s_00->frozen = false;
  s_00->localhost_only = true;
  s_00->pending_error = 0;
  s_00->child = (NetSocket *)0x0;
  s_00->parent = (NetSocket *)0x0;
  s_00->oobpending = false;
  s_00->outgoingeof = EOF_NO;
  s_00->incomingeof = false;
  s_00->listener = true;
  s_00->addr = (SockAddr *)plug_local;
  s_00->s = -1;
  if (*(int *)&plug_local[2].vt != 1) {
    __assert_fail("listenaddr->superfamily == UNIX",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                  ,0x6a6,"Socket *new_unix_listener(SockAddr *, Plug *)");
  }
  u.storage.__ss_align._4_4_ = socket(1,1,0);
  if ((int)u.storage.__ss_align._4_4_ < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    s_00->error = pcVar3;
  }
  else {
    cloexec(u.storage.__ss_align._4_4_);
    s_00->oobinline = false;
    memset(&addr,0,0x80);
    addr._0_2_ = 1;
    strncpy((char *)((long)&addr + 2),(char *)(plug_local + 4),0x6b);
    iVar1 = unlink((char *)((long)&addr + 2));
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 2) {
        close(u.storage.__ss_align._4_4_);
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        s_00->error = pcVar3;
        goto LAB_0015d3f6;
      }
    }
    iVar1 = bind(u.storage.__ss_align._4_4_,(sockaddr *)&addr,0x6e);
    if (iVar1 < 0) {
      close(u.storage.__ss_align._4_4_);
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      s_00->error = pcVar3;
    }
    else {
      iVar1 = listen(u.storage.__ss_align._4_4_,0x1000);
      if (iVar1 < 0) {
        close(u.storage.__ss_align._4_4_);
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        s_00->error = pcVar3;
      }
      else {
        s_00->s = u.storage.__ss_align._4_4_;
        uxsel_tell(s_00);
        add234(sktree,s_00);
      }
    }
  }
LAB_0015d3f6:
  listenaddr_local = (SockAddr *)&s_00->sock;
  return (Socket *)listenaddr_local;
}

Assistant:

Socket *new_unix_listener(SockAddr *listenaddr, Plug *plug)
{
    int s;
    union sockaddr_union u;
    union sockaddr_union *addr;
    int addrlen;
    NetSocket *ret;
    int retcode;

    /*
     * Create NetSocket structure.
     */
    ret = snew(NetSocket);
    ret->sock.vt = &NetSocket_sockvt;
    ret->error = NULL;
    ret->plug = plug;
    bufchain_init(&ret->output_data);
    ret->writable = false;             /* to start with */
    ret->sending_oob = 0;
    ret->frozen = false;
    ret->localhost_only = true;
    ret->pending_error = 0;
    ret->parent = ret->child = NULL;
    ret->oobpending = false;
    ret->outgoingeof = EOF_NO;
    ret->incomingeof = false;
    ret->listener = true;
    ret->addr = listenaddr;
    ret->s = -1;

    assert(listenaddr->superfamily == UNIX);

    /*
     * Open socket.
     */
    s = socket(AF_UNIX, SOCK_STREAM, 0);
    if (s < 0) {
        ret->error = strerror(errno);
        return &ret->sock;
    }

    cloexec(s);

    ret->oobinline = false;

    memset(&u, '\0', sizeof(u));
    u.su.sun_family = AF_UNIX;
#if __GNUC__ >= 8
#   pragma GCC diagnostic push
#   pragma GCC diagnostic ignored "-Wstringop-truncation"
#endif // __GNUC__ >= 8
    strncpy(u.su.sun_path, listenaddr->hostname, sizeof(u.su.sun_path)-1);
#if __GNUC__ >= 8
#   pragma GCC diagnostic pop
#endif // __GNUC__ >= 8
    addr = &u;
    addrlen = sizeof(u.su);

    if (unlink(u.su.sun_path) < 0 && errno != ENOENT) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

    retcode = bind(s, &addr->sa, addrlen);
    if (retcode < 0) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

    if (listen(s, SOMAXCONN) < 0) {
        close(s);
        ret->error = strerror(errno);
        return &ret->sock;
    }

    ret->s = s;

    uxsel_tell(ret);
    add234(sktree, ret);

    return &ret->sock;
}